

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddCustomCommandOldStyle
          (cmMakefile *this,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *depends,string *source,cmCustomCommandLines *commandLines,char *comment)

{
  size_t __n;
  pointer pcVar1;
  pointer pbVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var3;
  pointer this_00;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  cmCustomCommand *pcVar7;
  pointer pbVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __single_object cc;
  __single_object cc1;
  anon_class_40_2_eb7b3414 addRuleFileToTarget;
  RegularExpression sourceFiles;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_228;
  allocator_type local_219;
  cmMakefile *local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_1f8;
  _Any_data local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_1d0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_1c8;
  string local_1c0;
  string local_1a0;
  string local_180;
  pointer local_160;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  RegularExpression local_100;
  
  local_218 = this;
  std::make_unique<cmCustomCommand>();
  _Var3._M_head_impl = local_228._M_head_impl;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_118,depends);
  cmCustomCommand::SetDepends(_Var3._M_head_impl,&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  _Var3._M_head_impl = local_228._M_head_impl;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&local_130,
             &commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)
  ;
  cmCustomCommand::SetCommandLines(_Var3._M_head_impl,(cmCustomCommandLines *)&local_130);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_130);
  cmCustomCommand::SetComment(local_228._M_head_impl,comment);
  __n = source->_M_string_length;
  if ((__n == target->_M_string_length) &&
     ((__n == 0 ||
      (iVar5 = bcmp((source->_M_dataplus)._M_p,(target->_M_dataplus)._M_p,__n), iVar5 == 0)))) {
    local_1c8._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         local_228._M_head_impl;
    local_228._M_head_impl = (cmCustomCommand *)0x0;
    AddCustomCommandToTarget(local_218,target,POST_BUILD,&local_1c8);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_1c8)
    ;
  }
  else {
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(local_218->Targets)._M_h,target);
    local_158 = (undefined1  [8])
                ((long)iVar6.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                       ._M_cur + 0x28);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_158 = (undefined1  [8])0x0;
    }
    local_150._M_p = (pointer)&local_140;
    pcVar1 = (target->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + target->_M_string_length);
    local_100.regmust = (char *)0x0;
    local_100.program = (char *)0x0;
    local_100.progsize = 0;
    memset(&local_100,0,0xaa);
    cmsys::RegularExpression::compile
              (&local_100,
               "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|mpp|ixx|cppm|cu|m|mm|rc|def|r|odl|idl|hpj|bat|h|h\\+\\+|hm|hpp|hxx|in|txx|inl)$"
              );
    bVar4 = cmsys::RegularExpression::find
                      (&local_100,(source->_M_dataplus)._M_p,&local_100.regmatch);
    _Var3._M_head_impl = local_228._M_head_impl;
    if (bVar4) {
      pbVar8 = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != pbVar2) {
        do {
          _Var3._M_head_impl = local_228._M_head_impl;
          pcVar7 = (cmCustomCommand *)operator_new(0x138);
          cmCustomCommand::cmCustomCommand(pcVar7,_Var3._M_head_impl);
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          pcVar1 = (pbVar8->_M_dataplus)._M_p;
          local_210.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a0,pcVar1,pcVar1 + pbVar8->_M_string_length);
          cmCustomCommand::SetOutputs(pcVar7,&local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          this_00 = local_210.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          pcVar1 = (source->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,pcVar1,pcVar1 + source->_M_string_length);
          cmCustomCommand::SetMainDependency((cmCustomCommand *)this_00,&local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          local_1f8._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               local_210.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_210.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::function<void(cmSourceFile*)>::
          function<cmMakefile::AddCustomCommandOldStyle(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmCustomCommandLines_const&,char_const*)::__0&,void>
                    ((function<void(cmSourceFile*)> *)local_1f0._M_pod_data,
                     (anon_class_40_2_eb7b3414 *)local_158);
          AddCustomCommandToOutput
                    (local_218,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1f8,(CommandSourceCallback *)&local_1f0,false);
          if ((code *)local_1e0._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_1e0._M_allocated_capacity)(&local_1f0,&local_1f0,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1f8);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_210);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar2);
      }
    }
    else {
      pcVar1 = (source->_M_dataplus)._M_p;
      local_1f0._M_unused._M_object = &local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,pcVar1,pcVar1 + source->_M_string_length);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_1f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_210,__l,&local_219);
      cmCustomCommand::AppendDepends(_Var3._M_head_impl,&local_210);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_unused._0_8_ != &local_1e0) {
        operator_delete(local_1f0._M_unused._M_object,(ulong)(local_1e0._M_allocated_capacity + 1));
      }
      pbVar8 = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_160 = (outputs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != local_160) {
        do {
          _Var3._M_head_impl = local_228._M_head_impl;
          pcVar7 = (cmCustomCommand *)operator_new(0x138);
          cmCustomCommand::cmCustomCommand(pcVar7,_Var3._M_head_impl);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          pcVar1 = (pbVar8->_M_dataplus)._M_p;
          local_210.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,pcVar1,pcVar1 + pbVar8->_M_string_length);
          cmCustomCommand::SetOutputs(pcVar7,&local_180);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          local_1d0._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               local_210.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_210.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::function<void(cmSourceFile*)>::
          function<cmMakefile::AddCustomCommandOldStyle(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmCustomCommandLines_const&,char_const*)::__0&,void>
                    ((function<void(cmSourceFile*)> *)local_1f0._M_pod_data,
                     (anon_class_40_2_eb7b3414 *)local_158);
          AddCustomCommandToOutput
                    (local_218,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1d0,(CommandSourceCallback *)&local_1f0,false);
          if ((code *)local_1e0._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_1e0._M_allocated_capacity)(&local_1f0,&local_1f0,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_1d0);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_210);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != local_160);
      }
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
    }
  }
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_228);
  return;
}

Assistant:

void cmMakefile::AddCustomCommandOldStyle(
  const std::string& target, const std::vector<std::string>& outputs,
  const std::vector<std::string>& depends, const std::string& source,
  const cmCustomCommandLines& commandLines, const char* comment)
{
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetComment(comment);

  // Translate the old-style signature to one of the new-style
  // signatures.
  if (source == target) {
    // In the old-style signature if the source and target were the
    // same then it added a post-build rule to the target.  Preserve
    // this behavior.
    this->AddCustomCommandToTarget(target, cmCustomCommandType::POST_BUILD,
                                   std::move(cc));
    return;
  }

  auto ti = this->Targets.find(target);
  cmTarget* t = ti != this->Targets.end() ? &ti->second : nullptr;

  auto addRuleFileToTarget = [=](cmSourceFile* sf) {
    // If the rule was added to the source (and not a .rule file),
    // then add the source to the target to make sure the rule is
    // included.
    if (!sf->GetPropertyAsBool("__CMAKE_RULE")) {
      if (t) {
        t->AddSource(sf->ResolveFullPath());
      } else {
        cmSystemTools::Error("Attempt to add a custom rule to a target "
                             "that does not exist yet for target " +
                             target);
      }
    }
  };

  // Each output must get its own copy of this rule.
  cmsys::RegularExpression sourceFiles(
    "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|mpp|ixx|cppm|cu|m|mm|"
    "rc|def|r|odl|idl|hpj|bat|h|h\\+\\+|"
    "hm|hpp|hxx|in|txx|inl)$");

  // Choose whether to use a main dependency.
  if (sourceFiles.find(source)) {
    // The source looks like a real file.  Use it as the main dependency.
    for (std::string const& output : outputs) {
      auto cc1 = cm::make_unique<cmCustomCommand>(*cc);
      cc1->SetOutputs(output);
      cc1->SetMainDependency(source);
      this->AddCustomCommandToOutput(std::move(cc1), addRuleFileToTarget);
    }
  } else {
    cc->AppendDepends({ source });

    // The source may not be a real file.  Do not use a main dependency.
    for (std::string const& output : outputs) {
      auto cc1 = cm::make_unique<cmCustomCommand>(*cc);
      cc1->SetOutputs(output);
      this->AddCustomCommandToOutput(std::move(cc1), addRuleFileToTarget);
    }
  }
}